

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O3

IAnimatedMesh * __thiscall irr::scene::CMeshCache::getMeshByName(CMeshCache *this,path *name)

{
  undefined1 *this_00;
  uint uVar1;
  IAnimatedMesh *pIVar2;
  MeshEntry e;
  MeshEntry local_60;
  
  irr::io::SNamedPath::SNamedPath(&local_60.NamedPath,name);
  this_00 = &(this->super_IMeshCache).field_0x8;
  core::array<irr::scene::CMeshCache::MeshEntry>::sort
            ((array<irr::scene::CMeshCache::MeshEntry> *)this_00);
  pIVar2 = (IAnimatedMesh *)0x0;
  uVar1 = core::array<irr::scene::CMeshCache::MeshEntry>::binary_search
                    ((array<irr::scene::CMeshCache::MeshEntry> *)this_00,&local_60,0,
                     (int)((ulong)(*(long *)&(this->super_IMeshCache).field_0x10 -
                                  *(long *)&(this->super_IMeshCache).field_0x8) >> 3) * 0x38e38e39 +
                     -1);
  if (uVar1 != 0xffffffff) {
    pIVar2 = *(IAnimatedMesh **)(*(long *)this_00 + 0x40 + (ulong)uVar1 * 0x48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.NamedPath.InternalName.str._M_dataplus._M_p !=
      &local_60.NamedPath.InternalName.str.field_2) {
    operator_delete(local_60.NamedPath.InternalName.str._M_dataplus._M_p,
                    local_60.NamedPath.InternalName.str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.NamedPath.Path.str._M_dataplus._M_p != &local_60.NamedPath.Path.str.field_2) {
    operator_delete(local_60.NamedPath.Path.str._M_dataplus._M_p,
                    local_60.NamedPath.Path.str.field_2._M_allocated_capacity + 1);
  }
  return pIVar2;
}

Assistant:

IAnimatedMesh *CMeshCache::getMeshByName(const io::path &name)
{
	MeshEntry e(name);
	s32 id = Meshes.binary_search(e);
	return (id != -1) ? Meshes[id].Mesh : 0;
}